

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SanityCheckPass.h
# Opt level: O3

void __thiscall
soul::SanityCheckPass::PostResolutionChecks::visit(PostResolutionChecks *this,Assignment *a)

{
  int iVar1;
  char (*in_R9) [2];
  Type t;
  Type local_78;
  undefined1 local_60 [16];
  Structure *local_50;
  CompileMessage local_48;
  
  (*(this->super_ASTVisitor)._vptr_ASTVisitor[3])(this,(a->target).object);
  (*(this->super_ASTVisitor)._vptr_ASTVisitor[3])(this,(a->newValue).object);
  iVar1 = (*(((a->target).object)->super_Statement).super_ASTObject._vptr_ASTObject[0xf])();
  if ((char)iVar1 != '\0') {
    (*(((a->target).object)->super_Statement).super_ASTObject._vptr_ASTObject[4])(local_60);
    local_78.boundingSize = local_60._8_4_;
    local_78.arrayElementBoundingSize = local_60._12_4_;
    local_78.structure.object = local_50;
    if (local_50 != (Structure *)0x0) {
      (local_50->super_RefCountedObject).refCount = (local_50->super_RefCountedObject).refCount + 1;
    }
    local_78.primitiveType.type = SUB84(local_60._0_8_,4);
    local_78._0_2_ = SUB82(local_60._0_8_,0);
    local_78._2_2_ = 0;
    expectSilentCastPossible
              (&(a->super_Expression).super_Statement.super_ASTObject.context,&local_78,
               (a->newValue).object);
    RefCountedPtr<soul::Structure>::decIfNotNull(local_78.structure.object);
    RefCountedPtr<soul::Structure>::decIfNotNull(local_50);
    return;
  }
  CompileMessageHelpers::createMessage<char_const(&)[2]>
            (&local_48,(CompileMessageHelpers *)0x1,none,0x27cd42,"=",in_R9);
  AST::Context::throwError
            (&(a->super_Expression).super_Statement.super_ASTObject.context,&local_48,false);
}

Assistant:

void visit (AST::Assignment& a) override
        {
            super::visit (a);

            if (! a.target->isAssignable())
                a.context.throwError (Errors::operatorNeedsAssignableTarget ("="));

            expectSilentCastPossible (a.context,
                                      a.target->getResultType().withConstAndRefFlags (false, false),
                                      a.newValue);
        }